

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StatusOr<double> __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseFp<google::protobuf::json_internal::ParseProto2Descriptor>
          (anon_unknown_5 *this,JsonLexer *lex,
          Field<google::protobuf::json_internal::ParseProto2Descriptor> field)

{
  bool bVar1;
  byte bVar2;
  Status *pSVar3;
  Kind *pKVar4;
  LocationWith<double> *pLVar5;
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> *pLVar6;
  char cVar7;
  anon_union_8_2_a3c22f61_for_StatusOrData<double>_3 extraout_XMM0_Qa;
  StatusOr<double> SVar8;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  undefined1 local_140 [48];
  basic_string_view<char,_std::char_traits<char>_> local_110;
  undefined1 local_100 [16];
  char *local_f0;
  Status local_e8;
  Status _status_2;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  Status _status_1;
  StatusOr<google::protobuf::json_internal::LocationWith<double>_> d;
  double n;
  Status local_38;
  Status _status;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  Field<google::protobuf::json_internal::ParseProto2Descriptor> field_local;
  JsonLexer *lex_local;
  
  JsonLexer::PeekKind((JsonLexer *)&_status);
  pSVar3 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::status
                     ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)&_status);
  absl::lts_20240722::Status::Status(&local_38,pSVar3);
  bVar1 = absl::lts_20240722::Status::ok(&local_38);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20240722::StatusOr<double>::StatusOr<const_absl::lts_20240722::Status,_0>
              ((StatusOr<double> *)this,&local_38);
  }
  absl::lts_20240722::Status::~Status(&local_38);
  if (bVar1) goto LAB_004b5db0;
  pKVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::operator*
                     ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)&_status);
  if (*pKVar4 == kStr) {
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)&_status_2,lex);
    pSVar3 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&_status_2);
    absl::lts_20240722::Status::Status(&local_e8,pSVar3);
    bVar1 = absl::lts_20240722::Status::ok(&local_e8);
    cVar7 = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)cVar7) {
      absl::lts_20240722::StatusOr<double>::StatusOr<const_absl::lts_20240722::Status,_0>
                ((StatusOr<double> *)this,&local_e8);
    }
    absl::lts_20240722::Status::~Status(&local_e8);
    if (!(bool)cVar7) {
      pLVar6 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&_status_2);
      bVar1 = json_internal::operator==(&pLVar6->value,(char (*) [4])"NaN");
      if (bVar1) {
        d.super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>.field_1.data_.
        loc.path = (MessagePath *)0x7ff8000000000000;
      }
      else {
        pLVar6 = absl::lts_20240722::
                 StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&_status_2);
        bVar1 = json_internal::operator==(&pLVar6->value,(char (*) [9])0x6d158c);
        if (bVar1) {
          d.super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>.field_1.data_
          .loc.path = (MessagePath *)0x7ff0000000000000;
        }
        else {
          pLVar6 = absl::lts_20240722::
                   StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 *)&_status_2);
          bVar1 = json_internal::operator==(&pLVar6->value,(char (*) [10])"-Infinity");
          if (bVar1) {
            d.super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>.field_1.
            data_.loc.path = (MessagePath *)0xfff0000000000000;
          }
          else {
            pLVar6 = absl::lts_20240722::
                     StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   *)&_status_2);
            join_0x00000010_0x00000000_ = MaybeOwnedString::AsView(&pLVar6->value);
            bVar2 = absl::lts_20240722::SimpleAtod
                              (local_100._8_8_,local_100._16_8_,
                               (undefined1 *)
                               ((long)&d.
                                       super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>
                                       .field_1 + 0x20));
            if ((bVar2 & 1) == 0) {
              pLVar6 = absl::lts_20240722::
                       StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     *)&_status_2);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_110,"non-number characters in quoted number");
              JsonLocation::SourceLocation::current();
              JsonLocation::Invalid
                        ((JsonLocation *)local_100,&pLVar6->loc,local_110._M_len,local_110._M_str);
              absl::lts_20240722::StatusOr<double>::StatusOr<absl::lts_20240722::Status,_0>
                        ((StatusOr<double> *)this,(Status *)local_100);
              absl::lts_20240722::Status::~Status((Status *)local_100);
              cVar7 = '\x01';
              goto LAB_004b5be2;
            }
          }
        }
      }
      cVar7 = '\x04';
    }
LAB_004b5be2:
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 *)&_status_2);
  }
  else {
    if (*pKVar4 != kNum) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_140 + 0x10),
                 "expected number or string");
      JsonLocation::SourceLocation::current();
      JsonLexer::Invalid((JsonLexer *)(local_140 + 0x20),lex,local_140._16_8_,local_140._24_8_);
      absl::lts_20240722::StatusOr<double>::StatusOr<absl::lts_20240722::Status,_0>
                ((StatusOr<double> *)this,(Status *)(local_140 + 0x20));
      absl::lts_20240722::Status::~Status((Status *)(local_140 + 0x20));
      goto LAB_004b5db0;
    }
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&_status_1,lex);
    pSVar3 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>::
             status((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&_status_1);
    absl::lts_20240722::Status::Status
              ((Status *)
               &str.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_1.data_.loc.path,pSVar3);
    bVar1 = absl::lts_20240722::Status::ok
                      ((Status *)
                       &str.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        .field_1.data_.loc.path);
    cVar7 = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)cVar7) {
      absl::lts_20240722::StatusOr<double>::StatusOr<const_absl::lts_20240722::Status,_0>
                ((StatusOr<double> *)this,
                 (Status *)
                 &str.
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  .field_1.data_.loc.path);
    }
    absl::lts_20240722::Status::~Status
              ((Status *)
               &str.
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                .field_1.data_.loc.path);
    if (!(bool)cVar7) {
      pLVar5 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)
                            &_status_1);
      d.super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>.field_1.data_.loc
      .path = (MessagePath *)pLVar5->value;
      cVar7 = '\x04';
    }
    absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>::~StatusOr
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&_status_1);
  }
  if (cVar7 == '\x04') {
    bVar1 = Proto2Descriptor::Is32Bit(field);
    if (bVar1) {
      bVar1 = std::isfinite((double)d.
                                    super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>
                                    .field_1.data_.loc.path);
      if (bVar1) {
        bVar1 = std::isfinite((float)(double)d.
                                             super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>
                                             .field_1.data_.loc.path);
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_150,"float out of range");
          JsonLocation::SourceLocation::current();
          JsonLexer::Invalid((JsonLexer *)local_140,lex,local_150._M_len,local_150._M_str);
          absl::lts_20240722::StatusOr<double>::StatusOr<absl::lts_20240722::Status,_0>
                    ((StatusOr<double> *)this,(Status *)local_140);
          absl::lts_20240722::Status::~Status((Status *)local_140);
          goto LAB_004b5db0;
        }
      }
    }
    absl::lts_20240722::StatusOr<double>::StatusOr<double,_0>
              ((StatusOr<double> *)this,
               (double *)
               ((long)&d.super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>.
                       field_1 + 0x20));
  }
LAB_004b5db0:
  absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOr
            ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)&_status);
  SVar8.super_StatusOrData<double>.field_1.data_ = extraout_XMM0_Qa.data_;
  SVar8.super_StatusOrData<double>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<double>_1)this;
  return (StatusOr<double>)SVar8.super_StatusOrData<double>;
}

Assistant:

absl::StatusOr<double> ParseFp(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<JsonLexer::Kind> kind = lex.PeekKind();
  RETURN_IF_ERROR(kind.status());

  double n;
  switch (*kind) {
    case JsonLexer::kNum: {
      absl::StatusOr<LocationWith<double>> d = lex.ParseNumber();
      RETURN_IF_ERROR(d.status());
      n = d->value;
      break;
    }
    case JsonLexer::kStr: {
      absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
      RETURN_IF_ERROR(str.status());

      if (str->value == "NaN") {
        n = NAN;
      } else if (str->value == "Infinity") {
        n = INFINITY;
      } else if (str->value == "-Infinity") {
        n = -INFINITY;
      } else if (!absl::SimpleAtod(str->value.AsView(), &n)) {
        return str->loc.Invalid("non-number characters in quoted number");
      }
      break;
    }
    default:
      return lex.Invalid("expected number or string");
  }

  if (Traits::Is32Bit(field)) {
    // Detect out-of-range 32-bit floats by seeing whether the conversion result
    // is still finite. Finite extreme values may have textual representations
    // that parse to 64-bit values outside the 32-bit range, but which are
    // closer to the 32-bit extreme than to the "next value with the same
    // precision".
    if (std::isfinite(n) && !std::isfinite(static_cast<float>(n))) {
      return lex.Invalid("float out of range");
    }
  }

  return n;
}